

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O0

int __thiscall simple_thread_pool::ThreadHandle::shutdown(ThreadHandle *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  EventAwaiter *unaff_retaddr;
  
  EventAwaiter::invoke(unaff_retaddr);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&this->tHandle);
  if (bVar1) {
    std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x11517e);
    bVar1 = std::thread::joinable((thread *)this);
    if (bVar1) {
      std::__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<std::thread,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x11519a);
      std::thread::join();
    }
  }
  std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> *)
             unaff_retaddr);
  std::__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<std::thread,_(__gnu_cxx::_Lock_policy)2> *)unaff_retaddr);
  std::__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2>::reset
            ((__shared_ptr<simple_thread_pool::TaskHandle,_(__gnu_cxx::_Lock_policy)2> *)
             unaff_retaddr);
  return extraout_EAX;
}

Assistant:

void shutdown() {
        eaLoop.invoke();
        if (tHandle && tHandle->joinable()) {
            tHandle->join();
        }
        myself.reset();
        tHandle.reset();
        assignedTask.reset();
    }